

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O3

void __thiscall
FastVector<LargeBlock<8,_8192>_*,_false,_false>::grow_and_add
          (FastVector<LargeBlock<8,_8192>_*,_false,_false> *this,uint newSize,
          LargeBlock<8,_8192> **val)

{
  uint uVar1;
  LargeBlock<8,_8192> **ppLVar2;
  LargeBlock<8,_8192> *pLVar3;
  
  ppLVar2 = this->data;
  grow_no_destroy(this,newSize);
  pLVar3 = *val;
  uVar1 = this->count;
  this->count = uVar1 + 1;
  this->data[uVar1] = pLVar3;
  if (ppLVar2 != (LargeBlock<8,_8192> **)0x0) {
    (*(code *)NULLC::dealloc)(ppLVar2);
    return;
  }
  return;
}

Assistant:

void grow_and_add(unsigned newSize, const T& val)
	{
		T* oldData = data;
		unsigned oldMax = max;

		grow_no_destroy(newSize);

		data[count++] = val;

		if(oldData)
		{
			if(!skipConstructor)
				NULLC::destruct(oldData, oldMax);
			else
				NULLC::alignedDealloc(oldData);
		}
	}